

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameLoop.cpp
# Opt level: O2

void GameLoop(Maze *maze)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Room *this;
  ostream *poVar4;
  Room *pRVar5;
  char *pcVar6;
  Direction dir;
  ulong unaff_R12;
  string local_50;
  
  this = Maze::GetStart(maze);
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<(poVar4,"Welcome to the maze game! Use command x to E(x)it at any time.");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  do {
    std::operator<<((ostream *)&std::cout,"Do you want room labels turned on? (y/n): ");
    iVar2 = getchar();
    std::istream::ignore((long)&std::cin,1000);
    iVar3 = tolower((int)(char)iVar2);
    if (iVar3 == 0x79) {
      unaff_R12 = 1;
    }
    else if (iVar3 == 0x6e) {
      unaff_R12 = 0;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Invalid input, try again.");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    iVar2 = tolower((int)(char)iVar2);
  } while ((iVar2 != 0x79) && (iVar2 != 0x6e));
  do {
    bVar1 = false;
    do {
      pRVar5 = Maze::GetEnd(maze);
      if ((this == pRVar5) || (bVar1)) {
        pcVar6 = "Congratulations! You made it to the end! Now exiting.";
        if (bVar1) {
          pcVar6 = "We hope you come to play again!";
        }
        poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar4);
        return;
      }
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      if ((unaff_R12 & 1) == 0) {
        poVar4 = std::operator<<(poVar4,"You are in a room");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        poVar4 = std::operator<<(poVar4,"You are in a room with label: \'");
        Room::GetLabel_abi_cxx11_(&local_50,this);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,"\'");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::operator<<((ostream *)&std::cout,"You can go: ");
      pRVar5 = Room::GetRoom(this,NORTH);
      if (pRVar5 != (Room *)0x0) {
        std::operator<<((ostream *)&std::cout,"(n)orth  ");
      }
      pRVar5 = Room::GetRoom(this,EAST);
      if (pRVar5 != (Room *)0x0) {
        std::operator<<((ostream *)&std::cout,"(e)ast  ");
      }
      pRVar5 = Room::GetRoom(this,SOUTH);
      if (pRVar5 != (Room *)0x0) {
        std::operator<<((ostream *)&std::cout,"(s)outh  ");
      }
      dir = WEST;
      pRVar5 = Room::GetRoom(this,WEST);
      if (pRVar5 != (Room *)0x0) {
        std::operator<<((ostream *)&std::cout,"(w)est  ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"Please enter your command: ");
      iVar2 = getchar();
      std::istream::ignore((long)&std::cin,1000);
      iVar2 = tolower((int)(char)iVar2);
      bVar1 = true;
    } while (iVar2 == 0x78);
    if (iVar2 == 0x65) {
      dir = EAST;
      pcVar6 = "Moving one room to the east.";
LAB_00102b0a:
      pRVar5 = Room::GetRoom(this,dir);
      if (pRVar5 == (Room *)0x0) {
        pcVar6 = "You cannot go that way.";
        pRVar5 = this;
      }
    }
    else {
      if (iVar2 == 0x6e) {
        dir = NORTH;
        pcVar6 = "Moving one room to the north.";
        goto LAB_00102b0a;
      }
      if (iVar2 == 0x77) {
        pcVar6 = "Moving one room to the west.";
        goto LAB_00102b0a;
      }
      if (iVar2 == 0x73) {
        dir = SOUTH;
        pcVar6 = "Moving one room to the south.";
        goto LAB_00102b0a;
      }
      pcVar6 = "Invalid command!";
      pRVar5 = this;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    this = pRVar5;
  } while( true );
}

Assistant:

void GameLoop(Maze* maze)
{
    Room* currentRoom = maze->GetStart();
    bool exit = false;
    bool displayLabels;
    char labels;

    std::cout << std::endl << "Welcome to the maze game! Use command x to E(x)it at any time." << std::endl << std::endl;

    do
    {
        std::cout << "Do you want room labels turned on? (y/n): ";
        labels = std::getchar();
        std::cin.ignore(1000, '\n');

        if(tolower(labels) == 'y')
            displayLabels = true;
        else if(tolower(labels) == 'n')
            displayLabels = false;
        else
            std::cout << "Invalid input, try again." << std::endl << std::endl;

    } while(tolower(labels) != 'y' && tolower(labels) != 'n');

    while(currentRoom != maze->GetEnd() && !exit)
    {
        char command;

        if(displayLabels)
            std::cout << std::endl << "You are in a room with label: '" << currentRoom->GetLabel() << "'"<< std::endl;
        else
            std::cout << std::endl << "You are in a room" << std::endl;
        std::cout << "You can go: ";
        if(currentRoom->GetRoom(NORTH) != NULL)
            std::cout << "(n)orth  ";
        if(currentRoom->GetRoom(EAST) != NULL)
            std::cout << "(e)ast  ";
        if(currentRoom->GetRoom(SOUTH) != NULL)
            std::cout << "(s)outh  ";
        if(currentRoom->GetRoom(WEST) != NULL)
            std::cout << "(w)est  ";
        std::cout << std::endl;

        std::cout << "Please enter your command: ";
        command = std::getchar();
        std::cin.ignore(1000, '\n');

        switch(tolower(command))
        {
            case 'n':
            {
                Room *tmpRoom = currentRoom->GetRoom(NORTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the north." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'e':
            {
                Room *tmpRoom = currentRoom->GetRoom(EAST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the east." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 's':
            {
                Room *tmpRoom = currentRoom->GetRoom(SOUTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the south." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'w':
            {
                Room *tmpRoom = currentRoom->GetRoom(WEST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the west." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'x':
            {
                exit = true;
                break;
            }
            default:
            {
                std::cout << "Invalid command!" << std::endl;
            }
        }

    }

    if(exit)
    {
        std::cout << "We hope you come to play again!" << std::endl;
    }
    else
    {
        std::cout << "Congratulations! You made it to the end! Now exiting." << std::endl;
        return;
    }
}